

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O1

bool __thiscall MT32Emu::BReverbModelImpl<short>::isActive(BReverbModelImpl<short> *this)

{
  Bit32u BVar1;
  short *psVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  iVar3 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar3 == '\0') {
    bVar7 = false;
  }
  else {
    uVar4 = (ulong)this->currentSettings->numberOfAllpasses;
    bVar7 = uVar4 != 0;
    if (bVar7) {
      uVar5 = 0;
      do {
        psVar2 = (this->allpasses[uVar5]->super_RingBuffer<short>).buffer;
        if ((psVar2 != (short *)0x0) &&
           (BVar1 = (this->allpasses[uVar5]->super_RingBuffer<short>).size, BVar1 != 0)) {
          lVar6 = 0;
          do {
            if ((ushort)(psVar2[lVar6] - 9U) < 0xffef) {
              if (bVar7) {
                return true;
              }
              goto LAB_00180cf3;
            }
            lVar6 = lVar6 + 1;
          } while (BVar1 != (Bit32u)lVar6);
        }
        uVar5 = uVar5 + 1;
        bVar7 = uVar5 < uVar4;
      } while (uVar5 != uVar4);
    }
LAB_00180cf3:
    uVar4 = (ulong)this->currentSettings->numberOfCombs;
    bVar7 = uVar4 != 0;
    if (bVar7) {
      uVar5 = 0;
      do {
        psVar2 = (this->combs[uVar5]->super_RingBuffer<short>).buffer;
        if ((psVar2 != (short *)0x0) &&
           (BVar1 = (this->combs[uVar5]->super_RingBuffer<short>).size, BVar1 != 0)) {
          lVar6 = 0;
          do {
            if ((ushort)(psVar2[lVar6] - 9U) < 0xffef) {
              return bVar7;
            }
            lVar6 = lVar6 + 1;
          } while (BVar1 != (Bit32u)lVar6);
        }
        uVar5 = uVar5 + 1;
        bVar7 = uVar5 < uVar4;
      } while (uVar5 != uVar4);
    }
  }
  return bVar7;
}

Assistant:

bool isActive() const {
		if (!isOpen()) return false;
		for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
			if (!allpasses[i]->isEmpty()) return true;
		}
		for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
			if (!combs[i]->isEmpty()) return true;
		}
		return false;
	}